

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_disto.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  FILE *__stream;
  char *pcVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int keep_alpha;
  int iVar12;
  long lVar13;
  uint8_t *data;
  float disto [5];
  WebPPicture pic1;
  WebPPicture pic2;
  int in_stack_fffffffffffffd80;
  int local_27c;
  uint local_278;
  char *local_268;
  char *local_260;
  char *local_258;
  uint8_t *local_250;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  WebPPicture local_230;
  WebPPicture local_130;
  
  iVar5 = WebPPictureInitInternal(&local_230,0x210);
  if ((iVar5 == 0) || (iVar5 = WebPPictureInitInternal(&local_130,0x210), iVar5 == 0)) {
    main_cold_7();
    return 1;
  }
  if (argc < 2) {
    bVar2 = true;
    iVar8 = 0;
    local_278 = 1;
    bVar1 = false;
    local_27c = 0;
    bVar3 = true;
    local_260 = (char *)0x0;
    local_258 = (char *)0x0;
    local_268 = (char *)0x0;
    iVar5 = extraout_EDX;
  }
  else {
    iVar12 = 1;
    local_268 = (char *)0x0;
    local_258 = (char *)0x0;
    local_260 = (char *)0x0;
    bVar3 = false;
    local_27c = 0;
    bVar2 = false;
    bVar1 = false;
    iVar8 = 0;
    local_278 = 1;
    do {
      pcVar11 = argv[iVar12];
      iVar5 = strcmp(pcVar11,"-ssim");
      pcVar4 = local_260;
      if (iVar5 == 0) {
        iVar8 = 1;
        iVar5 = extraout_EDX_00;
      }
      else {
        iVar5 = strcmp(pcVar11,"-psnr");
        if (iVar5 == 0) {
          iVar8 = 0;
          iVar5 = extraout_EDX_01;
        }
        else {
          iVar5 = strcmp(pcVar11,"-alpha");
          if (iVar5 == 0) {
            bVar2 = true;
            iVar5 = extraout_EDX_02;
          }
          else {
            iVar5 = strcmp(pcVar11,"-scale");
            if (iVar5 == 0) {
              local_27c = 1;
              iVar5 = extraout_EDX_03;
            }
            else {
              iVar5 = strcmp(pcVar11,"-gray");
              if (iVar5 == 0) {
                bVar3 = true;
                iVar5 = extraout_EDX_04;
              }
              else {
                iVar5 = strcmp(pcVar11,"-h");
                if (iVar5 == 0) {
                  bVar1 = true;
                  local_278 = 0;
                  iVar5 = extraout_EDX_05;
                }
                else {
                  iVar6 = strcmp(pcVar11,"-o");
                  iVar5 = extraout_EDX_06;
                  if (iVar6 == 0) {
                    iVar12 = iVar12 + 1;
                    if (iVar12 == argc) {
                      fprintf(stderr,"missing file name after %s option.\n",pcVar11);
                      goto LAB_00103ccd;
                    }
                    local_268 = argv[iVar12];
                  }
                  else {
                    pcVar4 = pcVar11;
                    if (local_260 != (char *)0x0) {
                      pcVar4 = local_260;
                      local_258 = pcVar11;
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_260 = pcVar4;
      iVar12 = iVar12 + 1;
    } while (iVar12 < argc);
    bVar2 = !bVar2;
    bVar3 = !bVar3;
  }
  if (((bVar1) || (local_260 == (char *)0x0)) || (local_258 == (char *)0x0)) {
    if (!bVar1) {
      main_cold_6();
    }
    __stream = stderr;
    pcVar11 = WebPGetEnabledInputFileFormats();
    fprintf(__stream,
            "Usage: get_disto [-ssim][-psnr][-alpha] compressed.webp orig.webp\n  -ssim ..... print SSIM distortion\n  -psnr ..... print PSNR distortion (default)\n  -alpha .... preserve alpha plane\n  -h ........ this message\n  -o <file> . save the diff map as a WebP lossless file\n  -scale .... scale the difference map to fit [0..255] range\n  -gray ..... use grayscale for difference map (-scale)\n\nSupported input formats:\n  %s\n"
            ,pcVar11);
    goto LAB_00103ccd;
  }
  sVar9 = ReadPicture(local_260,&local_230,iVar5);
  sVar10 = ReadPicture(local_258,&local_130,keep_alpha);
  if ((sVar9 == 0) || (sVar10 == 0)) goto LAB_00103ccd;
  if (bVar2) {
    WebPBlendAlpha(&local_230,0);
    WebPBlendAlpha(&local_130,0);
  }
  iVar5 = WebPPictureDistortion(&local_230,&local_130,iVar8,&local_248);
  if (iVar5 == 0) {
    main_cold_5();
    goto LAB_00103ccd;
  }
  printf("%u %.2f    %.2f %.2f %.2f %.2f [ %.2f bpp ]\n",(double)local_238,(double)local_248,
         (double)local_244,(double)local_240,(double)local_23c,
         (double)((((float)sVar9 * 8.0) / (float)local_230.width) / (float)local_230.height),
         sVar9 & 0xffffffff);
  if (local_268 != (char *)0x0) {
    local_250 = (uint8_t *)0x0;
    if (local_230.use_argb == local_130.use_argb) {
      if (local_230.use_argb == 0) {
        main_cold_4();
        iVar5 = 7;
      }
      else {
        fwrite("max differences per channel: ",0x1d,1,stderr);
        lVar13 = 0;
        do {
          if (iVar8 == 1) {
            uVar7 = SSIMScaleChannel((uint8_t *)((long)local_230.argb + lVar13),
                                     local_230.argb_stride << 2,
                                     (uint8_t *)((long)local_130.argb + lVar13),
                                     local_130.argb_stride << 2,local_230.width,local_230.height,
                                     local_27c,in_stack_fffffffffffffd80);
          }
          else {
            uVar7 = DiffScaleChannel((uint8_t *)((long)local_230.argb + lVar13),
                                     local_230.argb_stride << 2,
                                     (uint8_t *)((long)local_130.argb + lVar13),
                                     local_130.argb_stride << 2,local_230.width,local_230.height,
                                     local_27c,in_stack_fffffffffffffd80);
          }
          if ((int)uVar7 < 0) {
            main_cold_2();
          }
          fprintf(stderr,"[%d]",(ulong)uVar7);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        fputc(10,stderr);
        if (!bVar3) {
          ConvertToGray(&local_230);
        }
        sVar9 = WebPEncodeLosslessBGRA
                          ((uint8_t *)local_230.argb,local_230.width,local_230.height,
                           local_230.argb_stride << 2,&local_250);
        if (sVar9 == 0) {
          main_cold_3();
          goto LAB_00103d7d;
        }
        iVar8 = ImgIoUtilWriteFile(local_268,local_250,sVar9);
        WebPFree(local_250);
        local_278 = (uint)(iVar8 == 0);
        iVar5 = 7;
        if (iVar8 != 0) {
          iVar5 = 0;
        }
      }
    }
    else {
      main_cold_1();
LAB_00103d7d:
      iVar5 = 7;
    }
    if (iVar5 == 7) goto LAB_00103ccd;
    if (iVar5 != 0) {
      return 0;
    }
  }
  local_278 = 0;
LAB_00103ccd:
  WebPPictureFree(&local_230);
  WebPPictureFree(&local_130);
  return local_278;
}

Assistant:

int main(int argc, const char* argv[]) {
  WebPPicture pic1, pic2;
  size_t size1 = 0, size2 = 0;
  int ret = EXIT_FAILURE;
  float disto[5];
  int type = 0;
  int c;
  int help = 0;
  int keep_alpha = 0;
  int scale = 0;
  int use_gray = 0;
  const char* name1 = NULL;
  const char* name2 = NULL;
  const char* output = NULL;

  INIT_WARGV(argc, argv);

  if (!WebPPictureInit(&pic1) || !WebPPictureInit(&pic2)) {
    fprintf(stderr, "Can't init pictures\n");
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  for (c = 1; c < argc; ++c) {
    if (!strcmp(argv[c], "-ssim")) {
      type = 1;
    } else if (!strcmp(argv[c], "-psnr")) {
      type = 0;
    } else if (!strcmp(argv[c], "-alpha")) {
      keep_alpha = 1;
    } else if (!strcmp(argv[c], "-scale")) {
      scale = 1;
    } else if (!strcmp(argv[c], "-gray")) {
      use_gray = 1;
    } else if (!strcmp(argv[c], "-h")) {
      help = 1;
      ret = EXIT_SUCCESS;
    } else if (!strcmp(argv[c], "-o")) {
      if (++c == argc) {
        fprintf(stderr, "missing file name after %s option.\n", argv[c - 1]);
        goto End;
      }
      output = (const char*)GET_WARGV(argv, c);
    } else if (name1 == NULL) {
      name1 = (const char*)GET_WARGV(argv, c);
    } else {
      name2 = (const char*)GET_WARGV(argv, c);
    }
  }
  if (help || name1 == NULL || name2 == NULL) {
    if (!help) {
      fprintf(stderr, "Error: missing arguments.\n");
    }
    Help();
    goto End;
  }
  size1 = ReadPicture(name1, &pic1, 1);
  size2 = ReadPicture(name2, &pic2, 1);
  if (size1 == 0 || size2 == 0) goto End;

  if (!keep_alpha) {
    WebPBlendAlpha(&pic1, 0x00000000);
    WebPBlendAlpha(&pic2, 0x00000000);
  }

  if (!WebPPictureDistortion(&pic1, &pic2, type, disto)) {
    fprintf(stderr, "Error while computing the distortion.\n");
    goto End;
  }
  printf("%u %.2f    %.2f %.2f %.2f %.2f [ %.2f bpp ]\n",
         (unsigned int)size1,
         disto[4], disto[0], disto[1], disto[2], disto[3],
         8.f * size1 / pic1.width / pic1.height);

  if (output != NULL) {
    uint8_t* data = NULL;
    size_t data_size = 0;
    if (pic1.use_argb != pic2.use_argb) {
      fprintf(stderr, "Pictures are not in the same argb format. "
                      "Can't save the difference map.\n");
      goto End;
    }
    if (pic1.use_argb) {
      int n;
      fprintf(stderr, "max differences per channel: ");
      for (n = 0; n < 3; ++n) {    // skip the alpha channel
        const int range = (type == 1) ?
          SSIMScaleChannel((uint8_t*)pic1.argb + n, pic1.argb_stride * 4,
                           (const uint8_t*)pic2.argb + n, pic2.argb_stride * 4,
                           4, pic1.width, pic1.height, scale) :
          DiffScaleChannel((uint8_t*)pic1.argb + n, pic1.argb_stride * 4,
                           (const uint8_t*)pic2.argb + n, pic2.argb_stride * 4,
                           4, pic1.width, pic1.height, scale);
        if (range < 0) fprintf(stderr, "\nError computing diff map\n");
        fprintf(stderr, "[%d]", range);
      }
      fprintf(stderr, "\n");
      if (use_gray) ConvertToGray(&pic1);
    } else {
      fprintf(stderr, "Can only compute the difference map in ARGB format.\n");
      goto End;
    }
#if !defined(WEBP_REDUCE_CSP)
    data_size = WebPEncodeLosslessBGRA((const uint8_t*)pic1.argb,
                                       pic1.width, pic1.height,
                                       pic1.argb_stride * 4,
                                       &data);
    if (data_size == 0) {
      fprintf(stderr, "Error during lossless encoding.\n");
      goto End;
    }
    ret = ImgIoUtilWriteFile(output, data, data_size) ? EXIT_SUCCESS
                                                      : EXIT_FAILURE;
    WebPFree(data);
    if (ret) goto End;
#else
    (void)data;
    (void)data_size;
    fprintf(stderr, "Cannot save the difference map. Please recompile "
                    "without the WEBP_REDUCE_CSP flag.\n");
    goto End;
#endif  // WEBP_REDUCE_CSP
  }
  ret = EXIT_SUCCESS;

 End:
  WebPPictureFree(&pic1);
  WebPPictureFree(&pic2);
  FREE_WARGV_AND_RETURN(ret);
}